

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

bool __thiscall
uWS::WebSocketProtocol<true>::consumeContinuation
          (WebSocketProtocol<true> *this,char **src,uint *length,void *user)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  uint *in_RDX;
  long *in_RSI;
  undefined1 *in_RDI;
  int s;
  int i;
  int n;
  bool in_stack_0000009f;
  int in_stack_000000a0;
  uint in_stack_000000a4;
  size_t in_stack_000000a8;
  char *in_stack_000000b0;
  WebSocketProtocol<true> *in_stack_000000b8;
  void *in_stack_000000d0;
  int local_30;
  bool local_1;
  
  if (*in_RDX < *(uint *)(in_RDI + 0x14)) {
    unmaskInplace((char *)*in_RSI,(char *)(*in_RSI + (ulong)(((*in_RDX >> 2) + 1) * 4)),
                  in_RDI + 0x18);
    *(uint *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) - *in_RDX;
    bVar3 = handleFragment(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                           in_stack_000000a0,in_stack_0000009f,in_stack_000000d0);
    if (bVar3) {
      local_1 = false;
    }
    else {
      if ((*in_RDX & 3) != 0) {
        rotateMask(4 - (*in_RDX & 3),in_RDI + 0x18);
      }
      local_1 = false;
    }
  }
  else {
    uVar1 = *(uint *)(in_RDI + 0x14);
    unmaskInplace((char *)*in_RSI,(char *)(*in_RSI + (long)(int)((uVar1 >> 2) << 2)),in_RDI + 0x18);
    local_30 = 0;
    uVar2 = *(uint *)(in_RDI + 0x14);
    for (; local_30 < (int)(uVar2 & 3); local_30 = local_30 + 1) {
      lVar4 = (long)(int)((uVar1 >> 2) * 4 + local_30);
      *(byte *)(*in_RSI + lVar4) = *(byte *)(*in_RSI + lVar4) ^ in_RDI[(long)local_30 + 0x18];
    }
    bVar3 = handleFragment(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                           in_stack_000000a0,in_stack_0000009f,in_stack_000000d0);
    if (bVar3) {
      local_1 = false;
    }
    else {
      if (in_RDI[3] != '\0') {
        in_RDI[2] = in_RDI[2] + -1;
      }
      *in_RSI = *in_RSI + (ulong)*(uint *)(in_RDI + 0x14);
      *in_RDX = *in_RDX - *(int *)(in_RDI + 0x14);
      *in_RDI = 0;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

inline bool consumeContinuation(char *&src, unsigned int &length, void *user) {
        if (remainingBytes <= length) {
            if (isServer) {
                int n = remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, mask);
                for (int i = 0, s = remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= mask[i];
                }
            }

            if (handleFragment(src, remainingBytes, 0, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (lastFin) {
                opStack--;
            }

            src += remainingBytes;
            length -= remainingBytes;
            state = READ_HEAD;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, mask);
            }

            remainingBytes -= length;
            if (handleFragment(src, length, remainingBytes, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), mask);
            }
            return false;
        }
    }